

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_action_inout(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  uint uVar1;
  lys_module *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  lysp_ext_instance *plVar5;
  uint uVar6;
  long lVar7;
  lysp_restr *must_p;
  lysp_ext_instance *plVar8;
  long lVar9;
  long lVar10;
  lysp_node *plVar11;
  
  uVar1 = ctx->compile_opts;
  plVar11 = pnode[1].parent;
  uVar6 = uVar1;
  if (plVar11 != (lysp_node *)0x0) {
    plVar2 = node[1].module;
    if (plVar2 == (lys_module *)0x0) {
      plVar4 = (long *)calloc(1,(long)plVar11[-1].exts * 0x38 + 8);
      if (plVar4 == (long *)0x0) goto LAB_00148bb2;
      lVar7 = 0;
      lVar9 = 0;
    }
    else {
      lVar9 = *(long *)&plVar2[-1].implemented;
      plVar4 = (long *)realloc(&plVar2[-1].implemented,
                               ((long)&(plVar11[-1].exts)->name + lVar9 * 2) * 0x38 + 8);
      if (plVar4 == (long *)0x0) {
LAB_00148bb2:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_node_action_inout");
        return LY_EMEM;
      }
      lVar7 = *plVar4;
    }
    node[1].module = (lys_module *)(plVar4 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar8 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar8 = pnode[1].parent[-1].exts;
    }
    lVar10 = 0;
    memset(plVar4 + lVar7 * 7 + 1,0,((long)&plVar8->name + lVar9) * 0x38);
    plVar8 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar11 = pnode[1].parent;
      if (plVar11 == (lysp_node *)0x0) {
        plVar5 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar5 = plVar11[-1].exts;
      }
      plVar8 = (lysp_ext_instance *)((long)&plVar8->name + 1);
      if (plVar5 <= plVar8) break;
      plVar2 = node[1].module;
      lVar9 = *(long *)&plVar2[-1].implemented;
      *(long *)&plVar2[-1].implemented = lVar9 + 1;
      must_p = (lysp_restr *)((long)&plVar11->parent + lVar10);
      lVar10 = lVar10 + 0x40;
      LVar3 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar2->ctx + lVar9 * 7));
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    uVar6 = ctx->compile_opts;
  }
  ctx->compile_opts = (uint)(pnode->nodetype != 0x1000) * 0x1000 + 0x1004 | uVar6;
  for (plVar11 = (lysp_node *)pnode[1].name; plVar11 != (lysp_node *)0x0; plVar11 = plVar11->next) {
    LVar3 = lys_compile_node(ctx,plVar11,node,0,(ly_set *)0x0);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  LVar3 = lys_compile_node_augments(ctx,node);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  ctx->compile_opts = uVar1;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_compile_node_action_inout(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node *child_p;
    uint32_t prev_options = ctx->compile_opts;

    struct lysp_node_action_inout *inout_p = (struct lysp_node_action_inout *)pnode;
    struct lysc_node_action_inout *inout = (struct lysc_node_action_inout *)node;

    COMPILE_ARRAY_GOTO(ctx, inout_p->musts, inout->musts, lys_compile_must, ret, done);
    ctx->compile_opts |= (inout_p->nodetype == LYS_INPUT) ? LYS_COMPILE_RPC_INPUT : LYS_COMPILE_RPC_OUTPUT;

    LY_LIST_FOR(inout_p->child, child_p) {
        LY_CHECK_GOTO(ret = lys_compile_node(ctx, child_p, node, 0, NULL), done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    ctx->compile_opts = prev_options;

done:
    return ret;
}